

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O1

char * Abc_SopCreateOr(Mem_Flex_t *pMan,int nVars,int *pfCompl)

{
  char *pcVar1;
  ulong uVar2;
  char cVar3;
  
  pcVar1 = Abc_SopStart(pMan,1,nVars);
  if (0 < nVars) {
    uVar2 = 0;
    do {
      if (pfCompl == (int *)0x0) {
        cVar3 = '0';
      }
      else {
        cVar3 = (char)pfCompl[uVar2] + '0';
      }
      pcVar1[uVar2] = cVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)nVars != uVar2);
  }
  pcVar1[(long)nVars + 1] = '0';
  return pcVar1;
}

Assistant:

char * Abc_SopCreateOr( Mem_Flex_t * pMan, int nVars, int * pfCompl )
{
    char * pSop;
    int i;
    pSop = Abc_SopStart( pMan, 1, nVars );
    for ( i = 0; i < nVars; i++ )
        pSop[i] = '0' + (pfCompl? pfCompl[i] : 0);
    pSop[nVars + 1] = '0';
    return pSop;
}